

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsBody.cpp
# Opt level: O1

void __thiscall
chrono::ChLoadBodyBodyBushingGeneric::ComputeBodyBodyForceTorque
          (ChLoadBodyBodyBushingGeneric *this,ChFrameMoving<double> *rel_AB,
          ChVector<double> *loc_force,ChVector<double> *loc_torque)

{
  double *pdVar1;
  undefined8 uVar2;
  bool bVar3;
  Index IVar4;
  uint uVar5;
  void *pvVar6;
  undefined8 *puVar7;
  ulong uVar8;
  double *pdVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  undefined1 auVar13 [16];
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  double dVar24;
  undefined1 auVar25 [16];
  double dVar27;
  undefined1 auVar26 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  double dVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  ChVectorDynamic<> mF;
  ChVectorDynamic<> mSdt;
  ChVectorDynamic<> mS;
  ChVector<double> rel_pos;
  ChVector<double> vect_rot;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_118;
  double local_100;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_f8;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_e8;
  double local_d8;
  double local_d0;
  double local_c8;
  ChVector<double> local_c0;
  double local_a8;
  double dStack_a0;
  double local_98;
  double local_88;
  double dStack_80;
  double local_78;
  ChVector<double> *local_70;
  double *local_68;
  double dStack_60;
  double dStack_58;
  undefined1 *puStack_50;
  double local_48;
  double dStack_40;
  long local_38;
  
  local_118.m_storage.m_data = (double *)0x0;
  local_118.m_storage.m_rows = 0;
  local_70 = loc_torque;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_118,6);
  local_e8.m_storage.m_data = (double *)0x0;
  local_e8.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_e8,6);
  local_f8.m_storage.m_data = (double *)0x0;
  local_f8.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_f8,6);
  local_a8 = (rel_AB->super_ChFrame<double>).coord.pos.m_data[0] +
             (this->neutral_displacement).coord.pos.m_data[0];
  dStack_a0 = (rel_AB->super_ChFrame<double>).coord.pos.m_data[1] +
              (this->neutral_displacement).coord.pos.m_data[1];
  local_98 = (rel_AB->super_ChFrame<double>).coord.pos.m_data[2] +
             (this->neutral_displacement).coord.pos.m_data[2];
  auVar23._8_8_ = 0;
  auVar23._0_8_ = (rel_AB->super_ChFrame<double>).coord.rot.m_data[0];
  dVar15 = (rel_AB->super_ChFrame<double>).coord.rot.m_data[1];
  auVar32._8_8_ = 0;
  auVar32._0_8_ = dVar15;
  dVar14 = (this->neutral_displacement).coord.rot.m_data[0];
  auVar25._8_8_ = 0;
  auVar25._0_8_ = dVar14;
  dVar17 = (this->neutral_displacement).coord.rot.m_data[1];
  auVar30._8_8_ = 0;
  auVar30._0_8_ = dVar17;
  dVar16 = (rel_AB->super_ChFrame<double>).coord.rot.m_data[2];
  auVar33._8_8_ = 0;
  auVar33._0_8_ = dVar16;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = (this->neutral_displacement).coord.rot.m_data[2];
  dVar18 = (rel_AB->super_ChFrame<double>).coord.rot.m_data[3];
  auVar35._8_8_ = 0;
  auVar35._0_8_ = dVar18;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = (this->neutral_displacement).coord.rot.m_data[3];
  auVar37._8_8_ = 0;
  auVar37._0_8_ = dVar14 * dVar15;
  auVar37 = vfmadd231sd_fma(auVar37,auVar23,auVar30);
  auVar37 = vfnmadd231sd_fma(auVar37,auVar35,auVar28);
  auVar37 = vfmadd231sd_fma(auVar37,auVar33,auVar21);
  auVar40._8_8_ = 0;
  auVar40._0_8_ = dVar14 * dVar16;
  auVar40 = vfmadd231sd_fma(auVar40,auVar23,auVar28);
  auVar40 = vfmadd231sd_fma(auVar40,auVar35,auVar30);
  auVar19 = vfnmadd231sd_fma(auVar40,auVar32,auVar21);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = dVar18 * dVar14;
  auVar40 = vfmadd231sd_fma(auVar41,auVar23,auVar21);
  auVar40 = vfnmadd231sd_fma(auVar40,auVar33,auVar30);
  auVar40 = vfmadd231sd_fma(auVar40,auVar32,auVar28);
  dVar39 = auVar19._0_8_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar39 * dVar39;
  auVar19 = vfmadd231sd_fma(auVar19,auVar37,auVar37);
  auVar19 = vfmadd231sd_fma(auVar19,auVar40,auVar40);
  auVar38 = SUB6416(ZEXT864(0),0) << 0x40;
  dVar14 = auVar19._0_8_;
  if (dVar14 <= 0.0) {
    local_88 = 1.0;
    dVar15 = 0.0;
    dStack_80 = 0.0;
  }
  else {
    local_d8 = auVar40._0_8_;
    local_c8 = auVar37._0_8_;
    auVar34._0_8_ = -dVar16;
    auVar34._8_8_ = 0x8000000000000000;
    auVar36._0_8_ = -dVar18;
    auVar36._8_8_ = 0x8000000000000000;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = dVar17 * -dVar15;
    auVar37 = vfmadd213sd_fma(auVar25,auVar23,auVar31);
    auVar37 = vfmadd213sd_fma(auVar28,auVar34,auVar37);
    auVar37 = vfmadd213sd_fma(auVar21,auVar36,auVar37);
    local_100 = auVar37._0_8_;
    local_d0 = dVar39;
    if (dVar14 < 0.0) {
      dVar15 = sqrt(dVar14);
    }
    else {
      auVar37 = vsqrtsd_avx(auVar19,auVar19);
      dVar15 = auVar37._0_8_;
    }
    dVar14 = local_100;
    local_100 = dVar15;
    dVar16 = atan2(dVar15,dVar14);
    dVar17 = 1.0 / local_100;
    dVar15 = dVar17 * local_c8;
    dVar14 = dVar17 * local_d0;
    dVar17 = dVar17 * local_d8;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = dVar14 * dVar14;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = dVar15;
    auVar37 = vfmadd231sd_fma(auVar20,auVar22,auVar22);
    auVar29._8_8_ = 0;
    auVar29._0_8_ = dVar17;
    auVar37 = vfmadd231sd_fma(auVar37,auVar29,auVar29);
    if (auVar37._0_8_ < 0.0) {
      local_100 = dVar16;
      local_d8 = dVar17;
      local_d0 = dVar14;
      local_c8 = dVar15;
      dVar18 = sqrt(auVar37._0_8_);
      dVar15 = local_c8;
      dVar14 = local_d0;
      dVar17 = local_d8;
      dVar16 = local_100;
    }
    else {
      auVar37 = vsqrtsd_avx(auVar37,auVar37);
      dVar18 = auVar37._0_8_;
    }
    auVar38._8_8_ = 0;
    auVar38._0_8_ = dVar16 + dVar16;
    bVar3 = 2.2250738585072014e-308 <= dVar18;
    dVar18 = 1.0 / dVar18;
    dStack_80 = (double)((ulong)bVar3 * (long)(dVar14 * dVar18));
    local_88 = (double)((ulong)bVar3 * (long)(dVar15 * dVar18) + (ulong)!bVar3 * 0x3ff0000000000000)
    ;
    dVar15 = (double)((ulong)bVar3 * (long)(dVar17 * dVar18));
  }
  IVar4 = local_e8.m_storage.m_rows;
  pdVar9 = local_e8.m_storage.m_data;
  dVar14 = auVar38._0_8_;
  if (dVar14 <= 3.141592653589793) {
    if (dVar14 < -3.141592653589793) {
      auVar38._8_8_ = 0;
      auVar38._0_8_ = dVar14 + 6.283185307179586;
    }
  }
  else {
    auVar38._8_8_ = 0;
    auVar38._0_8_ = dVar14 + -6.283185307179586;
  }
  uVar2 = vcmpsd_avx512f(auVar38,ZEXT816(0x400921fb54442d18),0xe);
  bVar3 = (bool)((byte)uVar2 & 1);
  auVar13._0_8_ =
       (double)((ulong)bVar3 * (long)(auVar38._0_8_ + -6.283185307179586) +
               (ulong)!bVar3 * (long)auVar38._0_8_);
  auVar13._8_8_ = auVar38._8_8_;
  uVar2 = vcmpsd_avx512f(auVar13,ZEXT816(0xc00921fb54442d18),1);
  bVar3 = (bool)((byte)uVar2 & 1);
  local_78 = (double)((ulong)bVar3 * (long)(auVar13._0_8_ + 6.283185307179586) +
                     (ulong)!bVar3 * (long)auVar13._0_8_);
  local_88 = local_78 * local_88;
  dStack_80 = local_78 * dStack_80;
  local_78 = local_78 * dVar15;
  if (2 < local_e8.m_storage.m_rows) {
    uVar12 = 3;
    if ((((ulong)local_e8.m_storage.m_data & 7) == 0) &&
       (uVar5 = -((uint)((ulong)local_e8.m_storage.m_data >> 3) & 0x1fffffff) & 7, uVar5 < 3)) {
      uVar12 = uVar5;
    }
    if (uVar12 != 0) {
      memcpy(local_e8.m_storage.m_data,&local_a8,(ulong)(uVar12 * 8));
    }
    if (uVar12 < 3) {
      uVar8 = (ulong)(uVar12 << 3);
      memcpy((void *)((long)pdVar9 + uVar8),(void *)((long)&local_a8 + uVar8),0x18 - uVar8);
    }
    if (5 < IVar4) {
      pdVar1 = pdVar9 + 3;
      uVar12 = 3;
      if ((((ulong)pdVar1 & 7) == 0) &&
         (uVar5 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7, uVar5 < 3)) {
        uVar12 = uVar5;
      }
      if (uVar12 != 0) {
        memcpy(pdVar1,&local_88,(ulong)(uVar12 * 8));
      }
      if (uVar12 < 3) {
        uVar8 = (ulong)(uVar12 << 3);
        memcpy((void *)((long)pdVar9 + uVar8 + 0x18),(void *)((long)&local_88 + uVar8),0x18 - uVar8)
        ;
      }
      if (2 < local_f8.m_storage.m_rows) {
        uVar8 = 3;
        if ((((ulong)local_f8.m_storage.m_data & 7) == 0) &&
           (uVar10 = (ulong)(-((uint)((ulong)local_f8.m_storage.m_data >> 3) & 0x1fffffff) & 7),
           uVar10 < 3)) {
          uVar8 = uVar10;
        }
        if (uVar8 != 0) {
          uVar10 = 0;
          do {
            local_f8.m_storage.m_data[uVar10] = (rel_AB->coord_dt).pos.m_data[uVar10];
            uVar10 = uVar10 + 1;
          } while (uVar8 != uVar10);
        }
        if (uVar8 < 3) {
          do {
            local_f8.m_storage.m_data[uVar8] = (rel_AB->coord_dt).pos.m_data[uVar8];
            uVar8 = uVar8 + 1;
          } while (uVar8 != 3);
        }
        ChFrameMoving<double>::GetWvel_par(rel_AB);
        if (5 < local_f8.m_storage.m_rows) {
          pdVar9 = local_f8.m_storage.m_data + 3;
          uVar8 = 3;
          if ((((ulong)pdVar9 & 7) == 0) &&
             (uVar10 = (ulong)(-((uint)((ulong)pdVar9 >> 3) & 0x1fffffff) & 7), uVar10 < 3)) {
            uVar8 = uVar10;
          }
          if (uVar8 != 0) {
            uVar10 = 0;
            do {
              pdVar9[uVar10] = (double)(&local_68)[uVar10];
              uVar10 = uVar10 + 1;
            } while (uVar8 != uVar10);
          }
          if (uVar8 < 3) {
            do {
              pdVar9[uVar8] = (double)(&local_68)[uVar8];
              uVar8 = uVar8 + 1;
            } while (uVar8 != 3);
          }
          if ((local_e8.m_storage.m_rows != 6) || (local_f8.m_storage.m_rows != 6)) {
            __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                          ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,
                          "Eigen::Product<Eigen::Matrix<double, 6, 6, 1>, Eigen::Matrix<double, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, 6, 6, 1>, Rhs = Eigen::Matrix<double, -1, 1>, Option = 0]"
                         );
          }
          dVar15 = *local_e8.m_storage.m_data;
          dVar14 = local_e8.m_storage.m_data[1];
          dVar17 = local_e8.m_storage.m_data[2];
          dVar16 = local_e8.m_storage.m_data[3];
          dVar18 = local_e8.m_storage.m_data[4];
          dVar39 = local_e8.m_storage.m_data[5];
          pdVar9 = (this->stiffness).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                   m_storage.m_data.array + 4;
          lVar11 = 0;
          do {
            dVar24 = dVar15 * ((plain_array<double,_36,_1,_32> *)(pdVar9 + -4))->array[0] +
                     dVar17 * pdVar9[-2] + dVar18 * *pdVar9;
            dVar27 = dVar14 * pdVar9[-3] + dVar16 * pdVar9[-1] + dVar39 * pdVar9[1];
            auVar26._0_8_ = dVar24 + dVar27;
            auVar26._8_8_ = dVar24 + dVar27;
            pdVar1 = (double *)vmovlpd_avx(auVar26);
            (&local_68)[lVar11] = pdVar1;
            lVar11 = lVar11 + 1;
            pdVar9 = pdVar9 + 6;
          } while (lVar11 != 6);
          dVar15 = *local_f8.m_storage.m_data;
          dVar14 = local_f8.m_storage.m_data[1];
          dVar17 = local_f8.m_storage.m_data[2];
          dVar16 = local_f8.m_storage.m_data[3];
          dVar18 = local_f8.m_storage.m_data[4];
          dVar39 = local_f8.m_storage.m_data[5];
          pdVar9 = (this->damping).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                   m_storage.m_data.array + 4;
          lVar11 = 0;
          do {
            (&local_68)[lVar11] =
                 (double *)
                 (dVar15 * ((plain_array<double,_36,_1,_32> *)(pdVar9 + -4))->array[0] +
                  dVar17 * pdVar9[-2] + dVar18 * *pdVar9 +
                  dVar14 * pdVar9[-3] + dVar16 * pdVar9[-1] + dVar39 * pdVar9[1] +
                 (double)(&local_68)[lVar11]);
            lVar11 = lVar11 + 1;
            pdVar9 = pdVar9 + 6;
          } while (lVar11 != 6);
          if (local_118.m_storage.m_rows != 6) {
            if (local_118.m_storage.m_data != (double *)0x0) {
              free((void *)local_118.m_storage.m_data[-1]);
            }
            pvVar6 = malloc(0x70);
            if (pvVar6 == (void *)0x0) {
              pdVar9 = (double *)0x0;
            }
            else {
              *(void **)(((ulong)pvVar6 & 0xffffffffffffffc0) + 0x38) = pvVar6;
              pdVar9 = (double *)(((ulong)pvVar6 & 0xffffffffffffffc0) + 0x40);
            }
            if (pdVar9 == (double *)0x0) {
              puVar7 = (undefined8 *)__cxa_allocate_exception(8);
              *puVar7 = std::ostream::_M_insert<bool>;
              __cxa_throw(puVar7,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
            }
            local_118.m_storage.m_rows = 6;
            local_118.m_storage.m_data = pdVar9;
          }
          if (local_118.m_storage.m_rows != 6) {
            __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                          "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                          "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, 6, 1, 0, 6, 1>, T1 = double, T2 = double]"
                         );
          }
          local_118.m_storage.m_data[2] = dStack_58;
          local_118.m_storage.m_data[3] = (double)puStack_50;
          local_118.m_storage.m_data[4] = local_48;
          local_118.m_storage.m_data[5] = dStack_40;
          *local_118.m_storage.m_data = (double)local_68;
          local_118.m_storage.m_data[1] = dStack_60;
          local_118.m_storage.m_data[2] = dStack_58;
          local_118.m_storage.m_data[3] = (double)puStack_50;
          local_68 = local_118.m_storage.m_data;
          dStack_60 = 1.48219693752374e-323;
          local_48 = 0.0;
          local_38 = local_118.m_storage.m_rows;
          puStack_50 = (undefined1 *)&local_118;
          ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
                    (&local_c0,
                     (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                      *)&local_68,(type *)0x0);
          dVar15 = (this->neutral_force).m_data[2];
          dVar14 = (this->neutral_force).m_data[1];
          loc_force->m_data[0] = local_c0.m_data[0] - (this->neutral_force).m_data[0];
          loc_force->m_data[1] = local_c0.m_data[1] - dVar14;
          loc_force->m_data[2] = local_c0.m_data[2] - dVar15;
          local_68 = local_118.m_storage.m_data + 3;
          dStack_60 = 1.48219693752374e-323;
          local_48 = 1.48219693752374e-323;
          local_38 = local_118.m_storage.m_rows;
          puStack_50 = (undefined1 *)&local_118;
          if (5 < local_118.m_storage.m_rows) {
            puStack_50 = (undefined1 *)&local_118;
            ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
                      (&local_c0,
                       (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                        *)&local_68,(type *)0x0);
            dVar15 = (this->neutral_torque).m_data[2];
            dVar14 = (this->neutral_torque).m_data[1];
            local_70->m_data[0] = local_c0.m_data[0] - (this->neutral_torque).m_data[0];
            local_70->m_data[1] = local_c0.m_data[1] - dVar14;
            local_70->m_data[2] = local_c0.m_data[2] - dVar15;
            if (local_f8.m_storage.m_data != (double *)0x0) {
              free((void *)local_f8.m_storage.m_data[-1]);
            }
            if (local_e8.m_storage.m_data != (double *)0x0) {
              free((void *)local_e8.m_storage.m_data[-1]);
            }
            if (local_118.m_storage.m_data != (double *)0x0) {
              free((void *)local_118.m_storage.m_data[-1]);
            }
            return;
          }
        }
      }
    }
  }
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

void ChLoadBodyBodyBushingGeneric::ComputeBodyBodyForceTorque(const ChFrameMoving<>& rel_AB,
                                                              ChVector<>& loc_force,
                                                              ChVector<>& loc_torque) {
    // compute local force & torque (assuming small rotations):
    ChVectorDynamic<> mF(6);
    ChVectorDynamic<> mS(6);
    ChVectorDynamic<> mSdt(6);
    ChVector<> rel_pos = rel_AB.GetPos() + neutral_displacement.GetPos();
    ChQuaternion<> rel_rot = rel_AB.GetRot() * neutral_displacement.GetRot();
    ChVector<> dir_rot;
    double angle_rot;
    rel_rot.Q_to_AngAxis(angle_rot, dir_rot);
    if (angle_rot > CH_C_PI)
        angle_rot -= CH_C_2PI;
    if (angle_rot < -CH_C_PI)
        angle_rot += CH_C_2PI;
    ChVector<> vect_rot = dir_rot * angle_rot;

    mS.segment(0, 3) = rel_pos.eigen();
    mS.segment(3, 3) = vect_rot.eigen();
    mSdt.segment(0, 3) = rel_AB.GetPos_dt().eigen();
    mSdt.segment(3, 3) = rel_AB.GetWvel_par().eigen();

    mF = stiffness * mS + damping * mSdt;

    loc_force = ChVector<>(mF.segment(0, 3)) - neutral_force;
    loc_torque = ChVector<>(mF.segment(3, 3)) - neutral_torque;
}